

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Reader * __thiscall capnp::DynamicValue::Reader::operator=(Reader *this,Reader *other)

{
  Reader *other_local;
  Reader *this_local;
  
  if (this->type == CAPABILITY) {
    kj::dtor<capnp::DynamicCapability::Client>(&(this->field_1).capabilityValue);
  }
  kj::ctor<capnp::DynamicValue::Reader,capnp::DynamicValue::Reader_const&>(this,other);
  return this;
}

Assistant:

DynamicValue::Reader& DynamicValue::Reader::operator=(const Reader& other) {
  if (type == CAPABILITY) {
    kj::dtor(capabilityValue);
  }
  kj::ctor(*this, other);
  return *this;
}